

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

Expression *
slang::ast::ReplicationExpression::fromSyntax
          (Compilation *compilation,MultipleConcatenationExpressionSyntax *syntax,
          ASTContext *context)

{
  SourceRange range;
  SourceRange range_00;
  SourceRange range_01;
  bitmask<slang::ast::ASTFlags> extraFlags;
  SourceRange sourceRange;
  optional<int> value;
  SourceRange range_02;
  SourceRange opRange;
  bool bVar1;
  bitwidth_t bVar2;
  Expression *pEVar3;
  int *piVar4;
  Type *pTVar5;
  Compilation *in_RDX;
  Compilation *in_RDI;
  optional<unsigned_int> width;
  optional<int> count;
  ConstantValue leftVal;
  EvalContext evalCtx;
  Diagnostic *diag;
  ReplicationExpression *result;
  Expression *right;
  Expression *left;
  undefined4 in_stack_fffffffffffff978;
  uint in_stack_fffffffffffff97c;
  Compilation *in_stack_fffffffffffff980;
  undefined4 in_stack_fffffffffffff988;
  bitwidth_t in_stack_fffffffffffff98c;
  undefined7 in_stack_fffffffffffff990;
  undefined1 in_stack_fffffffffffff997;
  SourceLocation in_stack_fffffffffffff998;
  undefined4 in_stack_fffffffffffff9a0;
  DiagCode in_stack_fffffffffffff9a4;
  undefined4 in_stack_fffffffffffff9a8;
  _Storage<int,_true> in_stack_fffffffffffff9ac;
  undefined4 in_stack_fffffffffffff9b0;
  DiagCode in_stack_fffffffffffff9b4;
  EvalContext *in_stack_fffffffffffff9b8;
  undefined7 in_stack_fffffffffffff9c0;
  bitmask<slang::ast::EvalFlags> in_stack_fffffffffffff9c7;
  Type *in_stack_fffffffffffff9c8;
  undefined4 in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d4;
  SourceLocation in_stack_fffffffffffff9d8;
  SourceLocation in_stack_fffffffffffff9e0;
  ConversionKind in_stack_fffffffffffff9f0;
  Expression *in_stack_fffffffffffffa08;
  undefined8 in_stack_fffffffffffffa40;
  bitwidth_t width_00;
  Compilation *in_stack_fffffffffffffa48;
  undefined8 in_stack_fffffffffffffa50;
  ReplicationExpression *pRVar6;
  bitmask<slang::ast::IntegralFlags> flags;
  Expression *in_stack_fffffffffffffa88;
  ASTContext *in_stack_fffffffffffffa90;
  bitmask<slang::ast::EvalFlags> extraFlags_00;
  bitmask<slang::ast::IntegralFlags> local_511;
  Type *local_510;
  not_null<const_slang::ast::Type_*> local_508;
  SourceRange local_500;
  Type *in_stack_fffffffffffffb38;
  ASTContext *in_stack_fffffffffffffb40;
  Type *in_stack_fffffffffffffb48;
  not_null<const_slang::ast::Type_*> in_stack_fffffffffffffb50;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffb58;
  not_null<const_slang::ast::Type_*> local_4a0;
  SourceLocation local_498;
  SourceLocation SStack_490;
  undefined4 local_484;
  bitmask<slang::ast::ASTFlags> local_480;
  SourceLocation local_478;
  SourceLocation SStack_470;
  _Optional_payload_base<int> local_468;
  bitmask<slang::ast::EvalFlags> local_459;
  _Optional_payload_base<int> local_458;
  Type *local_450;
  not_null<const_slang::ast::Type_*> local_448 [3];
  int local_430;
  bitmask<slang::ast::EvalFlags> local_3f1 [849];
  SourceLocation local_a0;
  SourceLocation local_98;
  SourceLocation local_90;
  SourceLocation local_88;
  Token local_80;
  SourceLocation local_70;
  undefined4 local_64;
  Diagnostic *local_60;
  SourceRange local_58;
  ReplicationExpression *local_48;
  bitmask<slang::ast::ASTFlags> local_40;
  Expression *local_38;
  bitmask<slang::ast::ASTFlags> local_30;
  Expression *local_28;
  Compilation *local_20;
  Compilation *local_10;
  ReplicationExpression *local_8;
  
  flags.m_bits = (underlying_type)((ulong)in_stack_fffffffffffffa50 >> 0x38);
  width_00 = (bitwidth_t)((ulong)in_stack_fffffffffffffa40 >> 0x20);
  local_20 = in_RDX;
  local_10 = in_RDI;
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0xbd8580);
  extraFlags_00.m_bits = (underlying_type)((ulong)in_RDI >> 0x38);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_30,None);
  extraFlags.m_bits._4_4_ = in_stack_fffffffffffff9a4;
  extraFlags.m_bits._0_4_ = in_stack_fffffffffffff9a0;
  local_28 = Expression::selfDetermined
                       ((Compilation *)in_stack_fffffffffffff998,
                        (ExpressionSyntax *)
                        CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
                        (ASTContext *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
                        extraFlags);
  not_null<slang::syntax::ConcatenationExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ConcatenationExpressionSyntax_*> *)0xbd85f7);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_40,None);
  local_38 = Expression::create((Compilation *)in_stack_fffffffffffffb50.ptr,
                                (ExpressionSyntax *)in_stack_fffffffffffffb48,
                                in_stack_fffffffffffffb40,in_stack_fffffffffffffb58,
                                in_stack_fffffffffffffb38);
  Compilation::getErrorType(local_10);
  local_58 = slang::syntax::SyntaxNode::sourceRange
                       ((SyntaxNode *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0))
  ;
  local_48 = BumpAllocator::
             emplace<slang::ast::ReplicationExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange>
                       ((BumpAllocator *)
                        CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                        (Type *)CONCAT44(in_stack_fffffffffffff9ac._M_value,
                                         in_stack_fffffffffffff9a8),
                        (Expression *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                        (Expression *)in_stack_fffffffffffff998,
                        (SourceRange *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990)
                       );
  bVar1 = Expression::bad((Expression *)in_stack_fffffffffffff980);
  if ((bVar1) || (bVar1 = Expression::bad((Expression *)in_stack_fffffffffffff980), bVar1)) {
    pEVar3 = Expression::badExpr(in_stack_fffffffffffff980,
                                 (Expression *)
                                 CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
    return pEVar3;
  }
  not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xbd8746);
  bVar1 = Type::isIntegral((Type *)in_stack_fffffffffffff980);
  if (bVar1) {
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xbd8765);
    bVar1 = Type::isIntegral((Type *)in_stack_fffffffffffff980);
    if (!bVar1) {
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xbd8786)
      ;
      bVar1 = Type::isString((Type *)0xbd878e);
      if (!bVar1) goto LAB_00bd8796;
    }
    bitmask<slang::ast::EvalFlags>::bitmask(local_3f1,CacheResults);
    EvalContext::EvalContext
              (in_stack_fffffffffffff9b8,
               (ASTContext *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
               in_stack_fffffffffffff9c7);
    Expression::eval((Expression *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988),
                     (EvalContext *)in_stack_fffffffffffff980);
    bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xbd897e);
    if (bVar1) {
      local_430 = 0;
    }
    else {
      bVar1 = Expression::isImplicitString(in_stack_fffffffffffffa08);
      if (bVar1) {
        pRVar6 = local_48;
        Compilation::getStringType(local_10);
        flags.m_bits = (underlying_type)((ulong)pRVar6 >> 0x38);
        SourceRange::SourceRange((SourceRange *)in_stack_fffffffffffff980);
        in_stack_fffffffffffff978 = 1;
        opRange.endLoc = in_stack_fffffffffffff9e0;
        opRange.startLoc = in_stack_fffffffffffff9d8;
        Expression::contextDetermined
                  ((ASTContext *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                   (Expression **)in_stack_fffffffffffff9c8,
                   (Expression *)
                   CONCAT17(in_stack_fffffffffffff9c7.m_bits,in_stack_fffffffffffff9c0),
                   (Type *)in_stack_fffffffffffff9b8,opRange,in_stack_fffffffffffff9f0);
        local_48->concat_ = local_38;
        pTVar5 = Compilation::getStringType(local_10);
        local_450 = pTVar5;
        not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>(local_448,&local_450)
        ;
        width_00 = (bitwidth_t)((ulong)pTVar5 >> 0x20);
        (local_48->super_Expression).type.ptr = local_448[0].ptr;
        local_8 = local_48;
        local_430 = 1;
        in_stack_fffffffffffffa48 = local_20;
      }
      else {
        EvalContext::reportAllDiags((EvalContext *)in_stack_fffffffffffff980);
        local_8 = (ReplicationExpression *)
                  Expression::badExpr(in_stack_fffffffffffff980,
                                      (Expression *)
                                      CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978))
        ;
        local_430 = 1;
      }
    }
    slang::ConstantValue::~ConstantValue((ConstantValue *)0xbd8b6d);
    if (local_430 == 0) {
      local_459.m_bits = '\0';
      bitmask<slang::ast::EvalFlags>::bitmask(&local_459);
      local_458 = (_Optional_payload_base<int>)
                  ASTContext::evalInteger
                            (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,extraFlags_00);
      bVar1 = std::optional::operator_cast_to_bool((optional<int> *)0xbd8bf7);
      if (bVar1) {
        piVar4 = std::optional<int>::operator*((optional<int> *)0xbd8c47);
        if (*piVar4 < 0) {
          local_468 = local_458;
          local_478 = (local_28->sourceRange).startLoc;
          SStack_470 = (local_28->sourceRange).endLoc;
          value.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _4_4_ = in_stack_fffffffffffff9b0;
          value.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _M_payload._M_value = in_stack_fffffffffffff9ac._M_value;
          range_01.endLoc._0_4_ = in_stack_fffffffffffff9a0;
          range_01.startLoc = in_stack_fffffffffffff998;
          range_01.endLoc._4_2_ = in_stack_fffffffffffff9a4.subsystem;
          range_01.endLoc._6_2_ = in_stack_fffffffffffff9a4.code;
          ASTContext::requireGtZero
                    ((ASTContext *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
                     value,range_01);
          local_8 = (ReplicationExpression *)
                    Expression::badExpr(in_stack_fffffffffffff980,
                                        (Expression *)
                                        CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978
                                                ));
          local_430 = 1;
        }
        else {
          piVar4 = std::optional<int>::operator*((optional<int> *)0xbd8ce7);
          if (*piVar4 == 0) {
            bitmask<slang::ast::ASTFlags>::bitmask(&local_480,InsideConcatenation);
            bVar1 = bitmask<slang::ast::ASTFlags>::has
                              ((bitmask<slang::ast::ASTFlags> *)
                               CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
                               (bitmask<slang::ast::ASTFlags> *)
                               CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              Compilation::getVoidType(local_10);
              not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>
                        (&local_4a0,(Type **)&stack0xfffffffffffffb58);
              (local_48->super_Expression).type.ptr = local_4a0.ptr;
              local_8 = local_48;
              local_430 = 1;
            }
            else {
              local_484 = 0x930007;
              local_498 = (local_28->sourceRange).startLoc;
              SStack_490 = (local_28->sourceRange).endLoc;
              sourceRange.startLoc._4_2_ = in_stack_fffffffffffff9a4.subsystem;
              sourceRange.startLoc._6_2_ = in_stack_fffffffffffff9a4.code;
              sourceRange.startLoc._0_4_ = in_stack_fffffffffffff9a0;
              sourceRange.endLoc._0_4_ = in_stack_fffffffffffff9a8;
              sourceRange.endLoc._4_4_ = in_stack_fffffffffffff9ac._M_value;
              ASTContext::addDiag((ASTContext *)in_stack_fffffffffffff998,in_stack_fffffffffffff9b4,
                                  sourceRange);
              local_8 = (ReplicationExpression *)
                        Expression::badExpr(in_stack_fffffffffffff980,
                                            (Expression *)
                                            CONCAT44(in_stack_fffffffffffff97c,
                                                     in_stack_fffffffffffff978));
              local_430 = 1;
            }
          }
          else {
            Expression::selfDetermined
                      ((ASTContext *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                       (Expression **)in_stack_fffffffffffff9c8);
            local_48->concat_ = local_38;
            not_null<const_slang::ast::Type_*>::operator->
                      ((not_null<const_slang::ast::Type_*> *)0xbd8e68);
            bVar1 = Type::isString((Type *)0xbd8e7f);
            if (bVar1) {
              Compilation::getStringType(local_10);
              not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>
                        ((not_null<const_slang::ast::Type_*> *)&stack0xfffffffffffffb50,
                         (Type **)&stack0xfffffffffffffb48);
              (local_48->super_Expression).type.ptr = in_stack_fffffffffffffb50.ptr;
              local_8 = local_48;
              local_430 = 1;
            }
            else {
              std::optional<int>::operator*((optional<int> *)0xbd8f15);
              SVInt::SVInt((SVInt *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
                           in_stack_fffffffffffff98c,(uint64_t)in_stack_fffffffffffff980,
                           SUB41(in_stack_fffffffffffff97c >> 0x18,0));
              pTVar5 = not_null<const_slang::ast::Type_*>::operator->
                                 ((not_null<const_slang::ast::Type_*> *)0xbd8f42);
              bVar2 = Type::getBitWidth((Type *)CONCAT44(in_stack_fffffffffffff98c,
                                                         in_stack_fffffffffffff988));
              SVInt::SVInt<unsigned_int>
                        ((SVInt *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
              SVInt::operator*((SVInt *)CONCAT44(in_stack_fffffffffffff9ac._M_value,
                                                 in_stack_fffffffffffff9a8),
                               (SVInt *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0
                                                ));
              local_500 = slang::syntax::SyntaxNode::sourceRange
                                    ((SyntaxNode *)CONCAT44(bVar2,in_stack_fffffffffffff9d0));
              range_02.endLoc = local_500.startLoc;
              range_02.startLoc = local_500.endLoc;
              ASTContext::requireValidBitWidth
                        (&in_stack_fffffffffffff9b8->astCtx,
                         (SVInt *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                         range_02);
              SVInt::~SVInt((SVInt *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
              SVInt::~SVInt((SVInt *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
              SVInt::~SVInt((SVInt *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
              bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0xbd9028);
              if (bVar1) {
                std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0xbd90ef);
                not_null<const_slang::ast::Type_*>::operator->
                          ((not_null<const_slang::ast::Type_*> *)0xbd9106);
                bVar1 = Type::isFourState(pTVar5);
                bitmask<slang::ast::IntegralFlags>::bitmask(&local_511,bVar1 * '\x02');
                local_510 = Compilation::getType(in_stack_fffffffffffffa48,width_00,flags);
                not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>
                          (&local_508,&local_510);
                (local_48->super_Expression).type.ptr = local_508.ptr;
                local_8 = local_48;
                local_430 = 1;
              }
              else {
                local_8 = (ReplicationExpression *)
                          Expression::badExpr(in_stack_fffffffffffff980,
                                              (Expression *)
                                              CONCAT44(in_stack_fffffffffffff97c,
                                                       in_stack_fffffffffffff978));
                local_430 = 1;
              }
            }
          }
        }
      }
      else {
        local_8 = (ReplicationExpression *)
                  Expression::badExpr(in_stack_fffffffffffff980,
                                      (Expression *)
                                      CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978))
        ;
        local_430 = 1;
      }
    }
    EvalContext::~EvalContext((EvalContext *)in_stack_fffffffffffff980);
  }
  else {
LAB_00bd8796:
    local_64 = 0x260007;
    not_null<slang::syntax::ConcatenationExpressionSyntax_*>::operator->
              ((not_null<slang::syntax::ConcatenationExpressionSyntax_*> *)0xbd87c4);
    local_80 = slang::syntax::SyntaxNode::getFirstToken
                         ((SyntaxNode *)
                          CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
    local_70 = parsing::Token::location(&local_80);
    local_60 = ASTContext::addDiag((ASTContext *)
                                   CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
                                   in_stack_fffffffffffff9a4,in_stack_fffffffffffff998);
    not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0xbd8836);
    ast::operator<<((Diagnostic *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                    in_stack_fffffffffffff9c8);
    not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0xbd885f);
    ast::operator<<((Diagnostic *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                    in_stack_fffffffffffff9c8);
    local_90 = (local_28->sourceRange).startLoc;
    local_88 = (local_28->sourceRange).endLoc;
    range.startLoc._4_4_ = in_stack_fffffffffffff98c;
    range.startLoc._0_4_ = in_stack_fffffffffffff988;
    range.endLoc._0_7_ = in_stack_fffffffffffff990;
    range.endLoc._7_1_ = in_stack_fffffffffffff997;
    Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffff980,range);
    local_a0 = (local_38->sourceRange).startLoc;
    local_98 = (local_38->sourceRange).endLoc;
    range_00.startLoc._4_4_ = in_stack_fffffffffffff98c;
    range_00.startLoc._0_4_ = in_stack_fffffffffffff988;
    range_00.endLoc._0_7_ = in_stack_fffffffffffff990;
    range_00.endLoc._7_1_ = in_stack_fffffffffffff997;
    Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffff980,range_00);
    local_8 = (ReplicationExpression *)
              Expression::badExpr(in_stack_fffffffffffff980,
                                  (Expression *)
                                  CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
  }
  return &local_8->super_Expression;
}

Assistant:

Expression& ReplicationExpression::fromSyntax(Compilation& compilation,
                                              const MultipleConcatenationExpressionSyntax& syntax,
                                              const ASTContext& context) {
    Expression& left = selfDetermined(compilation, *syntax.expression, context);
    Expression* right = &create(compilation, *syntax.concatenation, context);

    auto result = compilation.emplace<ReplicationExpression>(compilation.getErrorType(), left,
                                                             *right, syntax.sourceRange());
    if (left.bad() || right->bad())
        return badExpr(compilation, result);

    if (!left.type->isIntegral() || (!right->type->isIntegral() && !right->type->isString())) {
        auto& diag = context.addDiag(diag::BadReplicationExpression,
                                     syntax.concatenation->getFirstToken().location());
        diag << *left.type << *right->type;
        diag << left.sourceRange;
        diag << right->sourceRange;
        return badExpr(compilation, result);
    }

    // If the multiplier isn't constant this must be a string replication.
    EvalContext evalCtx(context, EvalFlags::CacheResults);
    if (ConstantValue leftVal = left.eval(evalCtx); !leftVal) {
        if (!right->isImplicitString()) {
            // They probably meant for this to be a constant (non-string) replication,
            // so do the normal error reporting for that case.
            evalCtx.reportAllDiags();
            return badExpr(compilation, result);
        }

        contextDetermined(context, right, result, compilation.getStringType(), {});

        result->concat_ = right;
        result->type = &compilation.getStringType();
        return *result;
    }

    std::optional<int32_t> count = context.evalInteger(left);
    if (!count)
        return badExpr(compilation, result);

    if (*count < 0) {
        context.requireGtZero(count, left.sourceRange);
        return badExpr(compilation, result);
    }

    if (*count == 0) {
        if (!context.flags.has(ASTFlags::InsideConcatenation)) {
            context.addDiag(diag::ReplicationZeroOutsideConcat, left.sourceRange);
            return badExpr(compilation, result);
        }

        // Use a placeholder type here to indicate to the parent concatenation that this had a
        // zero width.
        result->type = &compilation.getVoidType();
        return *result;
    }

    selfDetermined(context, right);
    result->concat_ = right;

    if (right->type->isString()) {
        result->type = &compilation.getStringType();
        return *result;
    }

    auto width = context.requireValidBitWidth(
        SVInt(32, uint64_t(*count), true) * right->type->getBitWidth(), syntax.sourceRange());
    if (!width)
        return badExpr(compilation, result);

    result->type = &compilation.getType(*width, right->type->isFourState()
                                                    ? IntegralFlags::FourState
                                                    : IntegralFlags::TwoState);
    return *result;
}